

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QFileSystemNode ** __thiscall
QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::operator[]
          (QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *this,QString *key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,QFileSystemModelPrivate::QFileSystemNode*>::tryEmplace_impl<QString_const&>
            (&local_28,(QHash<QString,QFileSystemModelPrivate::QFileSystemNode*> *)this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QFileSystemNode **)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
             [(uint)local_28.iterator.i.bucket & 0x7f]].storage.data + 0x18);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }